

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinstatsindex.cpp
# Opt level: O2

bool LookUpOne(CDBWrapper *db,BlockRef *block,DBVal *result)

{
  long lVar1;
  Span<const_std::byte> sp;
  bool bVar2;
  long lVar3;
  DBVal *pDVar4;
  long in_FS_OFFSET;
  bool bVar5;
  byte bVar6;
  Span<const_std::byte> key;
  DataStream DStack_158;
  DataStream local_138;
  DBHashKey local_118;
  pair<uint256,_(anonymous_namespace)::DBVal>_conflict read_out;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  strValue;
  
  bVar6 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar5 = false;
  memset(&read_out,0,0xa0);
  strValue.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._0_4_ = block->height;
  bVar2 = CDBWrapper::
          Read<(anonymous_namespace)::DBHeightKey,std::pair<uint256,(anonymous_namespace)::DBVal>>
                    (db,(DBHeightKey *)&strValue,&read_out);
  if (bVar2) {
    bVar2 = operator==((base_blob<256U> *)&read_out,(base_blob<256U> *)block);
    if (bVar2) {
      pDVar4 = &read_out.second;
      for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
        *(undefined8 *)(result->muhash).super_base_blob<256U>.m_data._M_elems =
             *(undefined8 *)(pDVar4->muhash).super_base_blob<256U>.m_data._M_elems;
        pDVar4 = (DBVal *)((long)pDVar4 + (ulong)bVar6 * -0x10 + 8);
        result = (DBVal *)((long)result + (ulong)bVar6 * -0x10 + 8);
      }
      bVar5 = true;
    }
    else {
      local_118.block_hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
           *(undefined8 *)(block->hash).super_base_blob<256U>.m_data._M_elems;
      local_118.block_hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
           *(undefined8 *)((block->hash).super_base_blob<256U>.m_data._M_elems + 8);
      local_118.block_hash.super_base_blob<256U>.m_data._M_elems._16_8_ =
           *(undefined8 *)((block->hash).super_base_blob<256U>.m_data._M_elems + 0x10);
      local_118.block_hash.super_base_blob<256U>.m_data._M_elems._24_8_ =
           *(undefined8 *)((block->hash).super_base_blob<256U>.m_data._M_elems + 0x18);
      local_138.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_138.m_read_pos = 0;
      local_138.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_138.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      DataStream::reserve(&local_138,0x40);
      DataStream::operator<<(&local_138,&local_118);
      key.m_data = local_138.vch.
                   super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_start + local_138.m_read_pos;
      key.m_size = (long)local_138.vch.
                         super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)key.m_data;
      CDBWrapper::ReadImpl_abi_cxx11_(&strValue,db,key);
      bVar5 = strValue.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_engaged != false;
      if (bVar5) {
        sp._4_12_ = strValue.
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._M_payload._4_12_;
        sp.m_data._0_4_ =
             strValue.
             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ._M_payload._0_4_;
        DataStream::DataStream(&DStack_158,sp);
        DataStream::Xor(&DStack_158,&db->obfuscate_key);
        Unserialize<DataStream,_(anonymous_namespace)::DBVal_&>(&DStack_158,result);
        std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                  ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&DStack_158);
      }
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&strValue);
      std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_138);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar5;
}

Assistant:

static bool LookUpOne(const CDBWrapper& db, const interfaces::BlockRef& block, DBVal& result)
{
    // First check if the result is stored under the height index and the value
    // there matches the block hash. This should be the case if the block is on
    // the active chain.
    std::pair<uint256, DBVal> read_out;
    if (!db.Read(DBHeightKey(block.height), read_out)) {
        return false;
    }
    if (read_out.first == block.hash) {
        result = std::move(read_out.second);
        return true;
    }

    // If value at the height index corresponds to an different block, the
    // result will be stored in the hash index.
    return db.Read(DBHashKey(block.hash), result);
}